

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O0

uint32 __thiscall
Js::SparseArraySegmentBase::RemoveUndefined
          (SparseArraySegmentBase *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  JavascriptLibrary *this_00;
  void **ppvVar5;
  undefined4 *puVar6;
  bool local_52;
  byte local_51;
  uint32 newLen;
  Type TStack_38;
  bool iIsMissingOrUndefined;
  uint32 countUndefined;
  uint32 j;
  uint32 i;
  RecyclableObject *undefined;
  SparseArraySegment<void_*> *_this;
  ScriptContext *scriptContext_local;
  SparseArraySegmentBase *this_local;
  
  if (this->length == 0) {
    this_local._4_4_ = 0;
  }
  else {
    undefined = (RecyclableObject *)this;
    _this = (SparseArraySegment<void_*> *)scriptContext;
    scriptContext_local = (ScriptContext *)this;
    this_00 = ScriptContext::GetLibrary(scriptContext);
    _j = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    countUndefined = 0;
    TStack_38 = this->length;
    newLen = 0;
    for (; TStack_38 = TStack_38 - 1, countUndefined <= TStack_38;
        countUndefined = countUndefined + 1) {
      while( true ) {
        local_51 = 0;
        if (countUndefined < TStack_38) {
          ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)(&undefined[1].type + countUndefined));
          bVar2 = IsMissingOrUndefined(*ppvVar5,_j,&newLen);
          local_51 = bVar2 ^ 0xff;
        }
        if ((local_51 & 1) == 0) break;
        countUndefined = countUndefined + 1;
      }
      bVar2 = TStack_38 <= countUndefined;
      while( true ) {
        local_52 = false;
        if (countUndefined < TStack_38) {
          ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)(&undefined[1].type + TStack_38));
          local_52 = IsMissingOrUndefined(*ppvVar5,_j,&newLen);
        }
        if (local_52 == false) break;
        TStack_38 = TStack_38 - 1;
      }
      if (TStack_38 <= countUndefined) {
        if (countUndefined != TStack_38) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                      ,0x6f,"(i == j)","i == j");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (bVar2) {
          ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                              ((WriteBarrierPtr *)(&undefined[1].type + TStack_38));
          bVar2 = IsMissingOrUndefined(*ppvVar5,_j,&newLen);
          if (!bVar2) break;
        }
        TStack_38 = TStack_38 - 1;
        break;
      }
      Memory::WriteBarrierPtr<void>::operator=
                ((WriteBarrierPtr<void> *)(&undefined[1].type + countUndefined),
                 (WriteBarrierPtr<void> *)(&undefined[1].type + TStack_38));
    }
    if (TStack_38 != this->length - 1) {
      uVar4 = TStack_38 + 1;
      if (this->length <= uVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                    ,0x7b,"(newLen < length)","newLen < length");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (this->length - uVar4 < newLen) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                    ,0x7c,"(countUndefined <= length - newLen)",
                                    "countUndefined <= length - newLen");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      SparseArraySegment<void_*>::Truncate
                ((SparseArraySegment<void_*> *)undefined,this->left + uVar4);
    }
    if (this->size < this->length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                  ,0x80,"(length <= size)","length <= size");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_local._4_4_ = newLen;
  }
  return this_local._4_4_;
}

Assistant:

uint32 SparseArraySegmentBase::RemoveUndefined(ScriptContext* scriptContext)
    {
        SparseArraySegment<Var> *_this = (SparseArraySegment<Var>*)this;
        // Shortcut length==0, otherwise the code below will AV when left==length==0. (WOOB 1114975)
        if (length == 0)
        {
            return 0;
        }

        //remove undefine values
        RecyclableObject *undefined = scriptContext->GetLibrary()->GetUndefined();

        uint32 i = 0;
        uint32 j = length - 1;
        uint32 countUndefined = 0;

        while (i <= j)
        {
            //get the first null/undefined slot from left
            while (i < j && !IsMissingOrUndefined(_this->elements[i], undefined, countUndefined))
            {
                i++;
            }
            bool iIsMissingOrUndefined = (i < j); // Flag to avoid test again if later j comes down to == i

            //get the first slot which is not null/undefined from the right
            while (i < j && IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
            {
                j--;
            }

            if (i < j)
            {
                //move
                _this->elements[i] = _this->elements[j];
                i++;
                j--;
            }
            else
            {
                Assert(i == j);
                if (iIsMissingOrUndefined || IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
                {
                    j--; // ok if j becomes -1. We'll truncate to length (j + 1).
                }
                break; // done
            }
        }

        if (j != length - 1) // Truncate if j has changed
        {
            uint32 newLen = j + 1;
            Assert(newLen < length);
            Assert(countUndefined <= length - newLen);

            _this->Truncate(left + newLen); // Truncate to new length (also clears moved elements)
        }
        AssertOrFailFast(length <= size);

        return countUndefined;
    }